

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DMDetector.cpp
# Opt level: O3

bool __thiscall
ZXing::DataMatrix::EdgeTracer::traceCorner(EdgeTracer *this,PointF dir,PointF *corner)

{
  PointT<double> *pPVar1;
  double dVar2;
  double dVar3;
  BitMatrix *pBVar4;
  uint uVar5;
  Value VVar6;
  ulong uVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  uint uVar11;
  double dVar12;
  double dVar13;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  PointT<double> p;
  PointT<double> p_00;
  PointT<double> p_01;
  undefined1 local_78 [32];
  double local_58;
  double dStack_50;
  
  BitMatrixCursor<ZXing::PointT<double>_>::step(&this->super_BitMatrixCursorF,1.0);
  pPVar1 = &(this->super_BitMatrixCursorF).p;
  dVar12 = (this->super_BitMatrixCursorF).p.y;
  corner->x = (this->super_BitMatrixCursorF).p.x;
  corner->y = dVar12;
  dVar12 = (this->super_BitMatrixCursorF).d.x;
  dVar13 = (this->super_BitMatrixCursorF).d.y;
  (this->super_BitMatrixCursorF).d.x = dir.x;
  (this->super_BitMatrixCursorF).d.y = dir.y;
  uVar5 = (uint)(ABS(dVar13) < ABS(dVar12));
  auVar16._0_4_ = (int)(uVar5 << 0x1f) >> 0x1f;
  auVar16._4_4_ = (int)(uVar5 << 0x1f) >> 0x1f;
  auVar16._8_4_ = (int)(uVar5 << 0x1f) >> 0x1f;
  auVar16._12_4_ = (int)(uVar5 << 0x1f) >> 0x1f;
  auVar14._8_8_ = 0;
  auVar14._0_8_ = -dVar12;
  auVar17._8_8_ = 0;
  auVar17._0_8_ = -dVar13;
  auVar17 = ~auVar16 & auVar17 << 0x40 | auVar14 & auVar16;
  iVar8 = 1;
  iVar9 = 3;
  do {
    iVar10 = 1;
    do {
      uVar7 = 0;
      while (iVar9 != (int)uVar7) {
        uVar11 = (int)uVar7 + 1;
        uVar5 = -(int)(uVar7 >> 1);
        if ((uVar7 & 1) != 0) {
          uVar5 = uVar11 >> 1;
        }
        local_58 = auVar17._0_8_;
        dStack_50 = auVar17._8_8_;
        p.x = (double)(int)uVar5 * local_58 +
              (this->super_BitMatrixCursorF).d.x * (double)iVar10 +
              (this->super_BitMatrixCursorF).p.x;
        p.y = (double)(int)uVar5 * dStack_50 +
              (this->super_BitMatrixCursorF).d.y * (double)iVar10 +
              (this->super_BitMatrixCursorF).p.y;
        p_00.x = local_58 + p.x;
        p_00.y = dStack_50 + p.y;
        VVar6 = BitMatrixCursor<ZXing::PointT<double>_>::testAt<double>
                          (&this->super_BitMatrixCursorF,p_00);
        uVar7 = (ulong)uVar11;
        if (VVar6.v == 1) {
          iVar8 = 3;
          goto LAB_0015344d;
        }
      }
      iVar10 = iVar10 + 1;
    } while (iVar10 != 3);
    iVar8 = iVar8 + 1;
    iVar9 = iVar9 + 2;
  } while (iVar8 != 4);
  goto LAB_00153559;
  while( true ) {
    local_78._0_8_ = (double)local_78._0_8_ - local_58;
    local_78._8_8_ = (double)local_78._8_8_ - dStack_50;
    p_01.x = (double)local_78._0_8_ - (this->super_BitMatrixCursorF).d.x;
    p_01.y = (double)local_78._8_8_ - (this->super_BitMatrixCursorF).d.y;
    VVar6 = BitMatrixCursor<ZXing::PointT<double>_>::testAt<double>
                      (&this->super_BitMatrixCursorF,p_01);
    uVar5 = (uint)(VVar6.v == 1);
    auVar15._0_8_ = CONCAT44((int)(uVar5 << 0x1f) >> 0x1f,(int)(uVar5 << 0x1f) >> 0x1f);
    auVar15._8_4_ = (int)(uVar5 << 0x1f) >> 0x1f;
    auVar15._12_4_ = (int)(uVar5 << 0x1f) >> 0x1f;
    auVar18._0_8_ =
         (ulong)((double)local_78._0_8_ - (this->super_BitMatrixCursorF).d.x) & auVar15._0_8_;
    auVar18._8_8_ =
         (ulong)((double)local_78._8_8_ - (this->super_BitMatrixCursorF).d.y) & auVar15._8_8_;
    p = (PointT<double>)(auVar18 | ~auVar15 & local_78._0_16_);
    iVar8 = iVar8 + -1;
    if (iVar8 == 0) break;
LAB_0015344d:
    local_78._0_8_ = p.x;
    if (((((double)local_78._0_8_ < 0.0) ||
         (pBVar4 = (this->super_BitMatrixCursorF).img,
         (double)pBVar4->_width <= (double)local_78._0_8_)) ||
        (local_78._8_8_ = p.y, (double)local_78._8_8_ < 0.0)) ||
       ((double)pBVar4->_height <= (double)local_78._8_8_)) break;
    VVar6 = BitMatrixCursor<ZXing::PointT<double>_>::testAt<double>(&this->super_BitMatrixCursorF,p)
    ;
    if (VVar6.v == 0) {
      dVar12 = floor((double)local_78._0_8_);
      dVar13 = floor((double)local_78._8_8_);
      pPVar1->x = dVar12 + 0.5;
      (this->super_BitMatrixCursorF).p.y = dVar13 + 0.5;
      break;
    }
  }
LAB_00153559:
  if (0.0 <= corner->x) {
    pBVar4 = (this->super_BitMatrixCursorF).img;
    dVar12 = (double)pBVar4->_width;
    if (dVar12 <= corner->x) {
      return false;
    }
    if (corner->y < 0.0) {
      return false;
    }
    dVar13 = (double)pBVar4->_height;
    if ((corner->y < dVar13) && (dVar2 = pPVar1->x, 0.0 <= dVar2)) {
      dVar3 = (this->super_BitMatrixCursorF).p.y;
      return (bool)(-(dVar3 < dVar13) & -(0.0 <= dVar3) & dVar2 < dVar12);
    }
  }
  return false;
}

Assistant:

bool traceCorner(PointF dir, PointF& corner)
	{
		step();
		log(p);
		corner = p;
		std::swap(d, dir);
		traceStep(-1 * dir, 2, false);
		printf("turn: %.0f x %.0f -> %.2f, %.2f\n", p.x, p.y, d.x, d.y);

		return isIn(corner) && isIn(p);
	}